

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

void image_manipulation::crop_image(clip_image_u8 *image,clip_image_u8 *dst,int x,int y,int w,int h)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  bool bVar9;
  
  dst->nx = w;
  dst->ny = h;
  this = &dst->buf;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,(long)(w * h * 3));
  uVar2 = 0;
  uVar3 = 0;
  if (0 < w) {
    uVar3 = (ulong)(uint)w;
  }
  uVar4 = (ulong)(uint)h;
  if (h < 1) {
    uVar4 = uVar2;
  }
  for (uVar5 = 0; uVar6 = uVar2, uVar7 = uVar3, iVar8 = x, uVar5 != uVar4; uVar5 = uVar5 + 1) {
    while (bVar9 = uVar7 != 0, uVar7 = uVar7 - 1, bVar9) {
      lVar1 = (long)(image->nx * y + iVar8) * 3;
      (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar6] =
           (image->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[lVar1];
      (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar6 + 1] =
           (image->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[lVar1 + 1];
      (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar6 + 2] =
           (image->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[lVar1 + 2];
      iVar8 = iVar8 + 1;
      uVar6 = uVar6 + 3;
    }
    y = y + 1;
    uVar2 = uVar2 + (long)w * 3;
  }
  return;
}

Assistant:

static void crop_image(const clip_image_u8 & image, clip_image_u8 & dst, int x, int y, int w, int h) {
        dst.nx = w;
        dst.ny = h;
        dst.buf.resize(3 * w * h);

        for (int i = 0; i < h; ++i) {
            for (int j = 0; j < w; ++j) {
                int src_idx = 3 * ((y + i)*image.nx + (x + j));
                int dst_idx = 3 * (i*w + j);
                dst.buf[dst_idx]     = image.buf[src_idx];
                dst.buf[dst_idx + 1] = image.buf[src_idx + 1];
                dst.buf[dst_idx + 2] = image.buf[src_idx + 2];
            }
        }
    }